

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_272f4d1::Mse16xHTest_DISABLED_SpeedMse_Test::TestBody
          (Mse16xHTest_DISABLED_SpeedMse_Test *this)

{
  ACMRandom *this_00;
  int dstride;
  int h;
  uint16_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  timeval local_70;
  timeval local_60;
  timeval local_50;
  timeval local_40;
  
  dstride = (this->super_Mse16xHTest).params_.width;
  h = (this->super_Mse16xHTest).params_.height;
  if (0 < (this->super_Mse16xHTest).mem_size) {
    this_00 = &(this->super_Mse16xHTest).rnd_;
    lVar4 = 0;
    do {
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_Mse16xHTest).dst_[lVar4] = (uint8_t)(uVar2 >> 0x17);
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      uVar3 = uVar2 >> 0xf & 0xffff;
      uVar1 = 0x4000;
      if (uVar3 < 0x4000) {
        uVar1 = (uint16_t)(uVar3 >> 6);
      }
      (this->super_Mse16xHTest).src_[lVar4] = uVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->super_Mse16xHTest).mem_size);
  }
  gettimeofday(&local_50,(__timezone_ptr_t)0x0);
  iVar5 = 10000000;
  do {
    aom_mse_16xh_16bit_c
              ((this->super_Mse16xHTest).dst_,dstride,(this->super_Mse16xHTest).src_,dstride,h);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  gettimeofday(&local_70,(__timezone_ptr_t)0x0);
  iVar5 = 10000000;
  do {
    (*(this->super_Mse16xHTest).params_.func)
              ((this->super_Mse16xHTest).dst_,dstride,(this->super_Mse16xHTest).src_,dstride,h);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  lVar6 = local_40.tv_usec - local_50.tv_usec;
  lVar4 = lVar6 + 1000000;
  if (-1 < lVar6) {
    lVar4 = lVar6;
  }
  dVar7 = (double)(lVar4 + ((lVar6 >> 0x3f) + (local_40.tv_sec - local_50.tv_sec)) * 1000000);
  gettimeofday(&local_60,(__timezone_ptr_t)0x0);
  lVar6 = local_60.tv_usec - local_70.tv_usec;
  lVar4 = lVar6 + 1000000;
  if (-1 < lVar6) {
    lVar4 = lVar6;
  }
  dVar8 = (double)(((lVar6 >> 0x3f) + (local_60.tv_sec - local_70.tv_sec)) * 1000000 + lVar4);
  printf("%dx%d\tc_time=%lf \t simd_time=%lf \t gain=%.31f\n",dVar7,dVar8,dVar7 / dVar8,
         (ulong)(uint)(this->super_Mse16xHTest).params_.width,
         (ulong)(uint)(this->super_Mse16xHTest).params_.height);
  return;
}

Assistant:

TEST_P(AvxMseTest, MaxMse) { MaxTestMse(); }